

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.h
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::needs_textformat_name_support
          (FieldGenerator *this)

{
  long lVar1;
  string local_30;
  
  variable_abi_cxx11_(&local_30,this,"fieldflags");
  lVar1 = std::__cxx11::string::find((char *)&local_30,0x375b3c,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return lVar1 != -1;
}

Assistant:

bool needs_textformat_name_support() const {
    const string& field_flags = variable("fieldflags");
    return field_flags.find("GPBFieldTextFormatNameCustom") != string::npos;
  }